

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InterpolateAtSampleRenderCase::
getIterationDescription_abi_cxx11_(string *__return_storage_ptr__,void *this,int iteration)

{
  char *__s;
  int local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  if (iteration == 0) {
    __s = "Test with float varying";
  }
  else {
    if (iteration < 4) {
      local_54 = iteration + 1;
      de::toString<int>(&local_30,&local_54);
      std::operator+(&local_50,"Test with vec",&local_30);
      std::operator+(__return_storage_ptr__,&local_50," varying");
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      return __return_storage_ptr__;
    }
    if (iteration == 4) {
      __s = "Test with array varying";
    }
    else {
      __s = glcts::fixed_sample_locations_values + 1;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string InterpolateAtSampleRenderCase::getIterationDescription (int iteration) const
{
	if (iteration == 0)
		return "Test with float varying";
	else if (iteration < 4)
		return "Test with vec" + de::toString(iteration+1) + " varying";
	else if (iteration == 4)
		return "Test with array varying";

	DE_ASSERT(false);
	return "";
}